

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-record.c
# Opt level: O0

int big_file_write_records(BigFile *bf,BigRecordType *rtype,ptrdiff_t offset,size_t size,void *buf)

{
  int iVar1;
  undefined1 local_2d0 [8];
  BigBlockPtr ptr;
  BigBlock block [1];
  BigArray array [1];
  int local_3c;
  int i;
  void *buf_local;
  size_t size_local;
  ptrdiff_t offset_local;
  BigRecordType *rtype_local;
  BigFile *bf_local;
  
  local_3c = 0;
  while( true ) {
    if (rtype->nfield <= (ulong)(long)local_3c) {
      return 0;
    }
    memset(local_2d0,0,0x18);
    iVar1 = big_record_view_field(rtype,local_3c,(BigArray *)&block[0].dirty,size,buf);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                      ,0xb0);
      return -1;
    }
    iVar1 = big_file_open_block(bf,(BigBlock *)&ptr.aoffset,rtype->fields[local_3c].name);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                      ,0xb3);
      return -1;
    }
    iVar1 = big_block_seek((BigBlock *)&ptr.aoffset,(BigBlockPtr *)local_2d0,offset);
    if (iVar1 != 0) break;
    iVar1 = big_block_write((BigBlock *)&ptr.aoffset,(BigBlockPtr *)local_2d0,
                            (BigArray *)&block[0].dirty);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                      ,0xb9);
      goto LAB_0010ea17;
    }
    iVar1 = big_block_close((BigBlock *)&ptr.aoffset);
    if (iVar1 != 0) {
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                      ,0xbc);
      return -1;
    }
    local_3c = local_3c + 1;
  }
  _big_file_raise((char *)0x0,
                  "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                  ,0xb6);
LAB_0010ea17:
  iVar1 = big_block_close((BigBlock *)&ptr.aoffset);
  if (iVar1 != 0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile-record.c"
                    ,0xc2);
    return -1;
  }
  return -1;
}

Assistant:

int
big_file_write_records(BigFile * bf,
    const BigRecordType * rtype,
    ptrdiff_t offset,
    size_t size,
    const void * buf)
{
    int i;
    for(i = 0; i < rtype->nfield; i ++) {
        BigArray array[1];
        BigBlock block[1];
        BigBlockPtr ptr = {0};

        /* rainwoodman: cast away the const. We don't really modify it.*/
        RAISEIF(0 != big_record_view_field(rtype, i, array, size, (void*) buf),
            ex_array,
            NULL);
        RAISEIF(0 != big_file_open_block(bf, block, rtype->fields[i].name),
            ex_open,
            NULL);
        RAISEIF(0 != big_block_seek(block, &ptr, offset),
            ex_seek,
            NULL);
        RAISEIF(0 != big_block_write(block, &ptr, array),
            ex_write,
            NULL);
        RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
        continue;
        ex_write:
        ex_seek:
            RAISEIF(0 != big_block_close(block),
            ex_close,
            NULL);
            return -1;
        ex_open:
        ex_close:
        ex_array:
            return -1;
    }
    return 0;
}